

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManPrint(Gia_Man_t *p)

{
  Gia_Obj_t *pObj;
  int v;
  
  v = 0;
  printf("GIA manager has %d ANDs, %d XORs, %d MUXes.\n",
         (ulong)(uint)(((~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) - p->nXors) - p->nMuxes));
  while( true ) {
    if (p->nObjs <= v) {
      return;
    }
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    Gia_ObjPrint(p,pObj);
    v = v + 1;
  }
  return;
}

Assistant:

void Gia_ManPrint( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    printf( "GIA manager has %d ANDs, %d XORs, %d MUXes.\n", 
        Gia_ManAndNum(p) - Gia_ManXorNum(p) - Gia_ManMuxNum(p), Gia_ManXorNum(p), Gia_ManMuxNum(p) ); 
    Gia_ManForEachObj( p, pObj, i )
        Gia_ObjPrint( p, pObj );
}